

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::IDLOptions::IDLOptions(IDLOptions *this)

{
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  IDLOptions *local_10;
  IDLOptions *this_local;
  
  this->gen_jvmstatic = false;
  this->use_flexbuffers = false;
  this->strict_json = false;
  this->output_default_scalars_in_json = false;
  this->indent_step = 2;
  this->cpp_minify_enums = false;
  this->output_enum_identifiers = true;
  this->prefixed_enums = true;
  this->scoped_enums = false;
  this->emit_min_max_enum_values = true;
  this->swift_implementation_only = false;
  this->include_dependence_headers = true;
  this->mutable_buffer = false;
  this->one_file = false;
  this->proto_mode = false;
  this->proto_oneof_union = false;
  this->generate_all = false;
  this->skip_unexpected_fields_in_json = false;
  this->generate_name_strings = false;
  this->generate_object_based_api = false;
  this->gen_compare = false;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->cpp_object_api_pointer_type,"std::unique_ptr",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::__cxx11::string::string((string *)&this->cpp_object_api_string_type);
  this->cpp_object_api_string_flexible_constructor = false;
  this->cpp_object_api_field_case_style = CaseStyle_Unchanged;
  this->cpp_direct_copy = true;
  this->gen_nullable = false;
  std::__cxx11::string::string((string *)&this->java_package_prefix);
  this->java_checkerframework = false;
  this->gen_generated = false;
  this->gen_json_coders = false;
  std::__cxx11::string::string((string *)&this->object_prefix);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->object_suffix,"T",local_25);
  std::allocator<char>::~allocator(local_25);
  this->union_value_namespacing = true;
  this->allow_non_utf8 = false;
  this->natural_utf8 = false;
  std::__cxx11::string::string((string *)&this->include_prefix);
  this->keep_prefix = false;
  this->binary_schema_comments = false;
  this->binary_schema_builtins = false;
  this->binary_schema_gen_embed = false;
  this->binary_schema_absolute_paths = false;
  std::__cxx11::string::string((string *)&this->go_import);
  std::__cxx11::string::string((string *)&this->go_namespace);
  std::__cxx11::string::string((string *)&this->go_module_name);
  this->protobuf_ascii_alike = false;
  this->size_prefixed = false;
  std::__cxx11::string::string((string *)&this->root_type);
  this->force_defaults = false;
  this->java_primitive_has_method = false;
  this->cs_gen_json_serializer = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->cpp_includes);
  std::__cxx11::string::string((string *)&this->cpp_std);
  this->cpp_static_reflection = false;
  std::__cxx11::string::string((string *)&this->proto_namespace_suffix);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->filename_suffix,"_generated",&local_26);
  std::allocator<char>::~allocator(&local_26);
  std::__cxx11::string::string((string *)&this->filename_extension);
  this->no_warnings = false;
  this->warnings_as_errors = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->project_root,"",&local_27);
  std::allocator<char>::~allocator(&local_27);
  this->cs_global_alias = false;
  this->json_nested_flatbuffers = true;
  this->json_nested_flexbuffers = true;
  this->json_nested_legacy_flatbuffers = false;
  this->ts_flat_files = false;
  this->ts_entry_points = false;
  this->ts_no_import_ext = false;
  this->no_leak_private_annotations = false;
  this->require_json_eof = true;
  this->keep_proto_id = false;
  this->python_no_type_prefix_suffix = false;
  this->python_typing = false;
  std::__cxx11::string::string((string *)&this->python_version);
  this->python_gen_numpy = true;
  this->ts_omit_entrypoint = false;
  this->proto_id_gap_action = WARNING;
  this->mini_reflect = kNone;
  this->require_explicit_ids = false;
  this->rust_serialize = false;
  this->rust_module_root_file = false;
  this->lang_to_generate = 0;
  this->set_empty_strings_to_null = true;
  this->set_empty_vectors_to_null = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->grpc_filename_suffix,".fb",&local_28);
  std::allocator<char>::~allocator(&local_28);
  this->grpc_use_system_headers = true;
  std::__cxx11::string::string((string *)&this->grpc_search_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->grpc_additional_headers);
  this->grpc_python_typed_handlers = false;
  return;
}

Assistant:

IDLOptions()
      : gen_jvmstatic(false),
        use_flexbuffers(false),
        strict_json(false),
        output_default_scalars_in_json(false),
        indent_step(2),
        cpp_minify_enums(false),
        output_enum_identifiers(true),
        prefixed_enums(true),
        scoped_enums(false),
        emit_min_max_enum_values(true),
        swift_implementation_only(false),
        include_dependence_headers(true),
        mutable_buffer(false),
        one_file(false),
        proto_mode(false),
        proto_oneof_union(false),
        generate_all(false),
        skip_unexpected_fields_in_json(false),
        generate_name_strings(false),
        generate_object_based_api(false),
        gen_compare(false),
        cpp_object_api_pointer_type("std::unique_ptr"),
        cpp_object_api_string_flexible_constructor(false),
        cpp_object_api_field_case_style(CaseStyle_Unchanged),
        cpp_direct_copy(true),
        gen_nullable(false),
        java_checkerframework(false),
        gen_generated(false),
        gen_json_coders(false),
        object_suffix("T"),
        union_value_namespacing(true),
        allow_non_utf8(false),
        natural_utf8(false),
        keep_prefix(false),
        binary_schema_comments(false),
        binary_schema_builtins(false),
        binary_schema_gen_embed(false),
        binary_schema_absolute_paths(false),
        protobuf_ascii_alike(false),
        size_prefixed(false),
        force_defaults(false),
        java_primitive_has_method(false),
        cs_gen_json_serializer(false),
        cpp_static_reflection(false),
        filename_suffix("_generated"),
        filename_extension(),
        no_warnings(false),
        warnings_as_errors(false),
        project_root(""),
        cs_global_alias(false),
        json_nested_flatbuffers(true),
        json_nested_flexbuffers(true),
        json_nested_legacy_flatbuffers(false),
        ts_flat_files(false),
        ts_entry_points(false),
        ts_no_import_ext(false),
        no_leak_private_annotations(false),
        require_json_eof(true),
        keep_proto_id(false),
        python_no_type_prefix_suffix(false),
        python_typing(false),
        python_gen_numpy(true),
        ts_omit_entrypoint(false),
        proto_id_gap_action(ProtoIdGapAction::WARNING),
        mini_reflect(IDLOptions::kNone),
        require_explicit_ids(false),
        rust_serialize(false),
        rust_module_root_file(false),
        lang_to_generate(0),
        set_empty_strings_to_null(true),
        set_empty_vectors_to_null(true),
        grpc_filename_suffix(".fb"),
        grpc_use_system_headers(true),
        grpc_python_typed_handlers(false) {}